

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnrealLoader.cpp
# Opt level: O0

void __thiscall
Assimp::UnrealImporter::InternReadFile
          (UnrealImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  string *__return_storage_ptr__;
  float fVar1;
  size_type *psVar2;
  char *pcVar3;
  bool bVar4;
  int8_t iVar5;
  uchar uVar6;
  __type _Var7;
  uint16_t uVar8;
  int16_t iVar9;
  int iVar10;
  uint uVar11;
  Logger *pLVar12;
  basic_formatter *pbVar13;
  IOStream *pIVar14;
  DeadlyImportError *pDVar15;
  reference v;
  __uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true> this_00;
  pointer pIVar16;
  long lVar17;
  ulong uVar18;
  reference ppVar19;
  size_type sVar20;
  pointer pTVar21;
  aiMesh **ppaVar22;
  aiMaterial **ppaVar23;
  void *pvVar24;
  aiMesh *this_01;
  reference pvVar25;
  ulong *puVar26;
  aiVector3D *paVar27;
  aiMaterial *this_02;
  size_t sVar28;
  reference ppVar29;
  reference pTVar30;
  difference_type dVar31;
  uint *puVar32;
  reference pvVar33;
  aiFace *paVar34;
  aiVector3t<float> *local_1308;
  aiVector3t<float> *local_12e0;
  aiFace *local_12b8;
  undefined1 local_1000 [8];
  FlipWindingOrderProcess flipper;
  MakeLeftHandedProcess hero;
  float local_fc8;
  uint local_fc4;
  uint i_3;
  aiFace *f;
  aiMesh *local_fb0;
  aiMesh *mesh;
  __normal_iterator<Assimp::Unreal::TempMat_*,_std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>_>
  local_fa0;
  __normal_iterator<Assimp::Unreal::TempMat_*,_std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>_>
  local_f98;
  iterator nt_1;
  TempMat mat_2;
  Triangle *tri_2;
  iterator __end1_3;
  iterator __begin1_3;
  vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> *__range1_3;
  __normal_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_f58;
  __normal_iterator<const_std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_f50;
  const_iterator it_1;
  uint tex;
  float local_f38;
  int local_f34;
  float opac;
  int twosided;
  aiString s;
  aiColor3D color;
  aiMaterial *mat_1;
  uint num;
  aiMesh *m;
  uint i_2;
  __normal_iterator<Assimp::Unreal::TempMat_*,_std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>_>
  local_ae0;
  __normal_iterator<Assimp::Unreal::TempMat_*,_std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>_>
  local_ad8;
  TempMat *local_ad0;
  __normal_iterator<Assimp::Unreal::TempMat_*,_std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>_>
  local_ac8;
  __normal_iterator<Assimp::Unreal::TempMat_*,_std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>_>
  local_ac0;
  iterator nt;
  TempMat mat;
  Triangle *tri_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> *__range1_2;
  vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> materials;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_a68;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_a60;
  const_iterator it;
  string local_a50 [32];
  size_type *local_a30;
  char *d_2;
  pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *me_1;
  allocator local_9f1;
  string local_9f0 [32];
  char *local_9d0;
  char *d_1;
  string local_9c0 [32];
  char *local_9a0;
  char *d;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *me;
  undefined1 local_950 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tempTextures;
  char *data;
  vector<char,_std::allocator<char>_> _data;
  string local_910;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_8f0;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> pb;
  aiNode *nd;
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  textures;
  int32_t val;
  aiVector3t<float> *vertex;
  iterator __end1_1;
  iterator __begin1_1;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *__range1_1;
  undefined1 local_898 [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertices;
  string local_878;
  int local_858;
  undefined1 local_852;
  allocator local_851;
  uint32_t st;
  uint local_830;
  allocator local_829;
  uint32_t numFrames;
  undefined1 local_808 [8];
  StreamReaderLE a_reader;
  string local_7c8;
  allocator local_7a1;
  string local_7a0;
  uint local_780;
  uint local_77c;
  uint local_778;
  uint i2;
  uint i_1;
  uint i;
  Triangle *tri;
  iterator __end1;
  iterator __begin1;
  vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> *__range1;
  undefined1 local_748 [8];
  vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> triangles;
  uint maxTexIdx;
  ushort local_706;
  ushort local_704;
  allocator local_701;
  undefined1 local_700 [2];
  uint16_t numVert;
  uint16_t numTris;
  undefined1 local_6e0 [8];
  StreamReaderLE d_reader;
  string local_6a0;
  allocator local_679;
  string local_678;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_658;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> p;
  string local_4d8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  string local_340;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128 [32];
  string local_108 [38];
  undefined1 local_e2;
  allocator local_e1;
  string local_e0;
  undefined1 local_b0 [8];
  string uc_path;
  string a_path;
  string d_path;
  string extension;
  size_type pos;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  UnrealImporter *this_local;
  
  std::__cxx11::string::find_last_of((char)pFile,0x2e);
  __return_storage_ptr__ = (string *)((long)&d_path.field_2 + 8);
  BaseImporter::GetExtension(__return_storage_ptr__,pFile);
  std::__cxx11::string::string((string *)(a_path.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(uc_path.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_b0);
  bVar4 = std::operator==(__return_storage_ptr__,"3d");
  if (bVar4) {
    lVar17 = std::__cxx11::string::find_last_of((char)pFile,0x5f);
    if (lVar17 == -1) {
      local_e2 = 1;
      pDVar15 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e0,"UNREAL: Unexpected naming scheme",&local_e1)
      ;
      DeadlyImportError::DeadlyImportError(pDVar15,&local_e0);
      local_e2 = 0;
      __cxa_throw(pDVar15,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    std::__cxx11::string::substr((ulong)local_108,(ulong)pFile);
    std::__cxx11::string::operator=((string *)(d_path.field_2._M_local_buf + 8),local_108);
    std::__cxx11::string::~string(local_108);
  }
  else {
    std::__cxx11::string::substr((ulong)local_128,(ulong)pFile);
    std::__cxx11::string::operator=((string *)(d_path.field_2._M_local_buf + 8),local_128);
    std::__cxx11::string::~string(local_128);
  }
  std::operator+(&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&d_path.field_2 + 8),"_d.3d");
  std::__cxx11::string::operator=((string *)(a_path.field_2._M_local_buf + 8),(string *)&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::operator+(&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&d_path.field_2 + 8),"_a.3d");
  std::__cxx11::string::operator=((string *)(uc_path.field_2._M_local_buf + 8),(string *)&local_168)
  ;
  std::__cxx11::string::~string((string *)&local_168);
  std::operator+(&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&d_path.field_2 + 8),".uc");
  std::__cxx11::string::operator=((string *)local_b0,(string *)&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  pLVar12 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[22]>(&local_320,(char (*) [22])"UNREAL: data file is ");
  pbVar13 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_320,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&a_path.field_2 + 8));
  Formatter::basic_formatter::operator_cast_to_string(&local_1a8,pbVar13);
  Logger::debug(pLVar12,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_320);
  pLVar12 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[22]>(&local_4b8,(char (*) [22])"UNREAL: aniv file is ");
  pbVar13 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_4b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&uc_path.field_2 + 8));
  Formatter::basic_formatter::operator_cast_to_string(&local_340,pbVar13);
  Logger::debug(pLVar12,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_4b8);
  pLVar12 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[20]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
             (char (*) [20])"UNREAL: uc file is ");
  pbVar13 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&p,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                      );
  Formatter::basic_formatter::operator_cast_to_string(&local_4d8,pbVar13);
  Logger::debug(pLVar12,&local_4d8);
  std::__cxx11::string::~string((string *)&local_4d8);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&p);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_678,"rb",&local_679);
  pIVar14 = IOSystem::Open(pIOHandler,(string *)((long)&a_path.field_2 + 8),&local_678);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_658,
             pIVar14);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator((allocator<char> *)&local_679);
  bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_658);
  if (!bVar4) {
    d_reader._54_1_ = 1;
    pDVar15 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_6a0,"UNREAL: Unable to open _d file",
               (allocator *)&d_reader.field_0x37);
    DeadlyImportError::DeadlyImportError(pDVar15,&local_6a0);
    d_reader._54_1_ = 0;
    __cxa_throw(pDVar15,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_700,"rb",&local_701);
  pIVar14 = IOSystem::Open(pIOHandler,(string *)((long)&a_path.field_2 + 8),(string *)local_700);
  StreamReader<false,_false>::StreamReader((StreamReader<false,_false> *)local_6e0,pIVar14,false);
  std::__cxx11::string::~string((string *)local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  local_704 = StreamReader<false,_false>::GetI2((StreamReader<false,_false> *)local_6e0);
  local_706 = StreamReader<false,_false>::GetI2((StreamReader<false,_false> *)local_6e0);
  StreamReader<false,_false>::IncPtr((StreamReader<false,_false> *)local_6e0,0x2c);
  if ((local_704 == 0) || (local_706 < 3)) {
    triangles.
    super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pDVar15 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&maxTexIdx,"UNREAL: Invalid number of vertices/triangles",
               (allocator *)
               ((long)&triangles.
                       super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    DeadlyImportError::DeadlyImportError(pDVar15,(string *)&maxTexIdx);
    triangles.
    super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pDVar15,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  triangles.super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  uVar18 = (ulong)local_704;
  std::allocator<Assimp::Unreal::Triangle>::allocator
            ((allocator<Assimp::Unreal::Triangle> *)((long)&__range1 + 7));
  std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>::vector
            ((vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> *)
             local_748,uVar18,(allocator<Assimp::Unreal::Triangle> *)((long)&__range1 + 7));
  std::allocator<Assimp::Unreal::Triangle>::~allocator
            ((allocator<Assimp::Unreal::Triangle> *)((long)&__range1 + 7));
  __end1 = std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>::begin
                     ((vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> *
                      )local_748);
  tri = (Triangle *)
        std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>::end
                  ((vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> *)
                   local_748);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Assimp::Unreal::Triangle_*,_std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>_>
                                     *)&tri), bVar4) {
    _i_1 = __gnu_cxx::
           __normal_iterator<Assimp::Unreal::Triangle_*,_std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>_>
           ::operator*(&__end1);
    for (i2 = 0; i2 < 3; i2 = i2 + 1) {
      uVar8 = StreamReader<false,_false>::GetI2((StreamReader<false,_false> *)local_6e0);
      _i_1->mVertex[i2] = uVar8;
      if (local_704 <= _i_1->mVertex[i2]) {
        pLVar12 = DefaultLogger::get();
        Logger::warn(pLVar12,"UNREAL: vertex index out of range");
        _i_1->mVertex[i2] = 0;
      }
    }
    iVar5 = StreamReader<false,_false>::GetI1((StreamReader<false,_false> *)local_6e0);
    _i_1->mType = iVar5;
    if ((this->configHandleFlags & 1U) == 0) {
      if ((_i_1->mType == '\x04') || (_i_1->mType == '\x03')) {
        _i_1->mType = '\x01';
      }
    }
    else {
      _i_1->mType = '\0';
    }
    StreamReader<false,_false>::IncPtr((StreamReader<false,_false> *)local_6e0,1);
    for (local_778 = 0; local_778 < 3; local_778 = local_778 + 1) {
      for (local_77c = 0; local_77c < 2; local_77c = local_77c + 1) {
        uVar6 = StreamReader<false,_false>::GetI1((StreamReader<false,_false> *)local_6e0);
        _i_1->mTex[local_778][local_77c] = uVar6;
      }
    }
    uVar6 = StreamReader<false,_false>::GetI1((StreamReader<false,_false> *)local_6e0);
    _i_1->mTextureNum = uVar6;
    local_780 = (uint)_i_1->mTextureNum;
    puVar32 = std::max<unsigned_int>
                        ((uint *)&triangles.
                                  super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_780);
    triangles.
    super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = *puVar32;
    StreamReader<false,_false>::IncPtr((StreamReader<false,_false> *)local_6e0,1);
    __gnu_cxx::
    __normal_iterator<Assimp::Unreal::Triangle_*,_std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>_>
    ::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7a0,"rb",&local_7a1);
  pIVar14 = IOSystem::Open(pIOHandler,(string *)((long)&uc_path.field_2 + 8),&local_7a0);
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::reset
            (&local_658,pIVar14);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_658);
  if (!bVar4) {
    a_reader._54_1_ = 1;
    pDVar15 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_7c8,"UNREAL: Unable to open _a file",
               (allocator *)&a_reader.field_0x37);
    DeadlyImportError::DeadlyImportError(pDVar15,&local_7c8);
    a_reader._54_1_ = 0;
    __cxa_throw(pDVar15,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&numFrames,"rb",&local_829);
  pIVar14 = IOSystem::Open(pIOHandler,(string *)((long)&uc_path.field_2 + 8),(string *)&numFrames);
  StreamReader<false,_false>::StreamReader((StreamReader<false,_false> *)local_808,pIVar14,false);
  std::__cxx11::string::~string((string *)&numFrames);
  std::allocator<char>::~allocator((allocator<char> *)&local_829);
  iVar9 = StreamReader<false,_false>::GetI2((StreamReader<false,_false> *)local_808);
  local_830 = (uint)iVar9;
  if (local_830 <= this->configFrameID) {
    local_852 = 1;
    pDVar15 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&st,"UNREAL: The requested frame does not exist",&local_851);
    DeadlyImportError::DeadlyImportError(pDVar15,(string *)&st);
    local_852 = 0;
    __cxa_throw(pDVar15,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  iVar9 = StreamReader<false,_false>::GetI2((StreamReader<false,_false> *)local_808);
  local_858 = (int)iVar9;
  if (local_858 != (uint)local_706 << 2) {
    vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pDVar15 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_878,"UNREAL: Unexpected aniv file length",
               (allocator *)
               ((long)&vertices.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    DeadlyImportError::DeadlyImportError(pDVar15,&local_878);
    vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pDVar15,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  StreamReader<false,_false>::IncPtr
            ((StreamReader<false,_false> *)local_808,
             (ulong)(this->configFrameID * (uint)local_706 * 4));
  uVar18 = (ulong)local_706;
  std::allocator<aiVector3t<float>_>::allocator
            ((allocator<aiVector3t<float>_> *)((long)&__range1_1 + 7));
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_898,uVar18,
             (allocator<aiVector3t<float>_> *)((long)&__range1_1 + 7));
  std::allocator<aiVector3t<float>_>::~allocator
            ((allocator<aiVector3t<float>_> *)((long)&__range1_1 + 7));
  __end1_1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_898)
  ;
  vertex = (aiVector3t<float> *)
           std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_898);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                             *)&vertex), bVar4) {
    v = __gnu_cxx::
        __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
        ::operator*(&__end1_1);
    textures.
    super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         StreamReader<false,_false>::GetI4((StreamReader<false,_false> *)local_808);
    Unreal::DecompressVertex
              (v,textures.
                 super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    __gnu_cxx::
    __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&nd);
  this_00.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>)
       operator_new(0x478);
  aiNode::aiNode((aiNode *)
                 this_00.
                 super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
                 super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl);
  pScene->mRootNode =
       (aiNode *)
       this_00.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
       super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
       super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl;
  pb._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       this_00.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
       super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
       super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl;
  aiString::Set((aiString *)
                this_00.
                super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
                super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl,"<UnrealRoot>");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_910,"rb",
             (allocator *)&_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17)
  ;
  pIVar14 = IOSystem::Open(pIOHandler,(string *)local_b0,&local_910);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_8f0,
             pIVar14);
  std::__cxx11::string::~string((string *)&local_910);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
  pIVar16 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                      (&local_8f0);
  if (pIVar16 == (pointer)0x0) {
    pLVar12 = DefaultLogger::get();
    Logger::error(pLVar12,"Unable to open .uc file");
  }
  else {
    std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&data);
    pIVar16 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                        (&local_8f0);
    BaseImporter::TextFileToBuffer
              (pIVar16,(vector<char,_std::allocator<char>_> *)&data,FORBID_EMPTY);
    tempTextures.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)&data,0);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_950);
    for (; ((tempTextures.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage)->first)._M_dataplus !=
           (_Alloc_hider)0x0;
        tempTextures.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)&((tempTextures.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).field_0x1) {
      bVar4 = TokenMatchI((char **)&tempTextures.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"#exec",5);
      if (bVar4) {
        SkipSpacesAndLineEnd<char>
                  ((char **)&tempTextures.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar4 = TokenMatchI((char **)&tempTextures.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"TEXTURE",7
                           );
        if (bVar4) {
          SkipSpacesAndLineEnd<char>
                    ((char **)&tempTextures.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar4 = TokenMatchI((char **)&tempTextures.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"IMPORT",
                              6);
          if (bVar4) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&me);
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_950,(value_type *)&me);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&me);
            d = (char *)std::
                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_950);
            while (bVar4 = IsLineEnd<char>((char)((tempTextures.
                                                                                                      
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->first)._M_dataplus), ((bVar4 ^ 0xffU) & 1) != 0
                  ) {
              iVar10 = ASSIMP_strincmp((char *)tempTextures.
                                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       "NAME=",5);
              if (iVar10 == 0) {
                local_9a0 = &((tempTextures.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).field_0x5
                ;
                tempTextures.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_9a0;
                while (bVar4 = IsSpaceOrNewLine<char>
                                         ((char)((tempTextures.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 )->first)._M_dataplus), pcVar3 = local_9a0,
                      ((bVar4 ^ 0xffU) & 1) != 0) {
                  tempTextures.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)&((tempTextures.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                                 field_0x1;
                }
                uVar18 = (long)tempTextures.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)local_9a0;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_9c0,pcVar3,uVar18,(allocator *)((long)&d_1 + 7));
                std::__cxx11::string::operator=((string *)d,local_9c0);
                std::__cxx11::string::~string(local_9c0);
                std::allocator<char>::~allocator((allocator<char> *)((long)&d_1 + 7));
              }
              else {
                iVar10 = ASSIMP_strincmp((char *)tempTextures.
                                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         "FILE=",5);
                if (iVar10 == 0) {
                  local_9d0 = &((tempTextures.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                               field_0x5;
                  tempTextures.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_9d0;
                  while (bVar4 = IsSpaceOrNewLine<char>
                                           ((char)((tempTextures.
                                                                                                        
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->first)._M_dataplus), pcVar3 = local_9d0,
                        ((bVar4 ^ 0xffU) & 1) != 0) {
                    tempTextures.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)&((tempTextures.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                                   field_0x1;
                  }
                  uVar18 = (long)tempTextures.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage -
                           (long)local_9d0;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_9f0,pcVar3,uVar18,&local_9f1);
                  std::__cxx11::string::operator=((string *)(d + 0x20),local_9f0);
                  std::__cxx11::string::~string(local_9f0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
                }
              }
              tempTextures.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)&((tempTextures.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).field_0x1
              ;
            }
            lVar17 = std::__cxx11::string::length();
            if ((lVar17 == 0) || (lVar17 = std::__cxx11::string::length(), lVar17 == 0)) {
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::pop_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_950);
            }
          }
        }
        else {
          bVar4 = TokenMatchI((char **)&tempTextures.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"MESHMAP"
                              ,7);
          if (bVar4) {
            SkipSpacesAndLineEnd<char>
                      ((char **)&tempTextures.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar4 = TokenMatchI((char **)&tempTextures.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                "SETTEXTURE",10);
            if (bVar4) {
              std::
              pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ((pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&me_1);
              std::
              vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::push_back((vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&nd,(value_type *)&me_1);
              std::
              pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&me_1);
              d_2 = (char *)std::
                            vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::back((vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&nd);
              while (bVar4 = IsLineEnd<char>((char)((tempTextures.
                                                                                                          
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->first)._M_dataplus), ((bVar4 ^ 0xffU) & 1) != 0
                    ) {
                iVar10 = ASSIMP_strincmp((char *)tempTextures.
                                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         "NUM=",4);
                if (iVar10 == 0) {
                  tempTextures.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)&((tempTextures.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                                 field_0x4;
                  uVar11 = strtoul10((char *)tempTextures.
                                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (char **)&tempTextures.
                                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  *(uint *)d_2 = uVar11;
                }
                else {
                  iVar10 = ASSIMP_strincmp((char *)tempTextures.
                                                                                                      
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           ,"TEXTURE=",8);
                  if (iVar10 == 0) {
                    local_a30 = &((tempTextures.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                                 _M_string_length;
                    tempTextures.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_a30;
                    while (bVar4 = IsSpaceOrNewLine<char>
                                             ((char)((tempTextures.
                                                                                                            
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->first)._M_dataplus), psVar2 = local_a30,
                          ((bVar4 ^ 0xffU) & 1) != 0) {
                      tempTextures.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)&((tempTextures.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                                     field_0x1;
                    }
                    uVar18 = (long)tempTextures.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)local_a30;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              (local_a50,(char *)psVar2,uVar18,
                               (allocator *)((long)&it._M_current + 7));
                    std::__cxx11::string::operator=((string *)(d_2 + 8),local_a50);
                    std::__cxx11::string::~string(local_a50);
                    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
                    local_a68._M_current =
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)std::
                            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_950);
                    __gnu_cxx::
                    __normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>const*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>
                    ::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                              ((__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>const*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>
                                *)&local_a60,&local_a68);
                    while( true ) {
                      materials.
                      super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)std::
                                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)local_950);
                      bVar4 = __gnu_cxx::operator!=
                                        (&local_a60,
                                         (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          *)&materials.
                                             super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      if (!bVar4) break;
                      ppVar19 = __gnu_cxx::
                                __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ::operator*(&local_a60);
                      _Var7 = std::operator==(&ppVar19->first,
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)(d_2 + 8));
                      if (_Var7) {
                        ppVar19 = __gnu_cxx::
                                  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ::operator*(&local_a60);
                        std::__cxx11::string::operator=
                                  ((string *)(d_2 + 8),(string *)&ppVar19->second);
                        break;
                      }
                      __gnu_cxx::
                      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator++(&local_a60);
                    }
                  }
                }
                tempTextures.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)&((tempTextures.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                               field_0x1;
              }
            }
            else {
              bVar4 = TokenMatchI((char **)&tempTextures.
                                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  "SCALE",5);
              if (bVar4) {
                while (bVar4 = IsLineEnd<char>((char)((tempTextures.
                                                                                                              
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->first)._M_dataplus), ((bVar4 ^ 0xffU) & 1) != 0
                      ) {
                  if ((((tempTextures.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->first)._M_dataplus ==
                       (_Alloc_hider)0x58) &&
                     (((tempTextures.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).field_0x1 == '='
                     )) {
                    tempTextures.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)fast_atoreal_move<float>
                                            (&((tempTextures.
                                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                              ->first).field_0x2,
                                             (float *)((long)pb._M_t.
                                                  super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                                                  .super__Head_base<0UL,_Assimp::IOStream_*,_false>.
                                                  _M_head_impl + 0x404),true);
                  }
                  else if ((((tempTextures.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                            _M_dataplus == (_Alloc_hider)0x59) &&
                          (((tempTextures.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).field_0x1
                           == '=')) {
                    tempTextures.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)fast_atoreal_move<float>
                                            (&((tempTextures.
                                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                              ->first).field_0x2,
                                             (float *)((long)pb._M_t.
                                                  super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                                                  .super__Head_base<0UL,_Assimp::IOStream_*,_false>.
                                                  _M_head_impl + 0x418),true);
                  }
                  else if ((((tempTextures.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                            _M_dataplus == (_Alloc_hider)0x5a) &&
                          (((tempTextures.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).field_0x1
                           == '=')) {
                    tempTextures.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)fast_atoreal_move<float>
                                            (&((tempTextures.
                                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                              ->first).field_0x2,
                                             (float *)((long)pb._M_t.
                                                  super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                                                  .super__Head_base<0UL,_Assimp::IOStream_*,_false>.
                                                  _M_head_impl + 0x42c),true);
                  }
                  tempTextures.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)&((tempTextures.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                                 field_0x1;
                }
              }
            }
          }
        }
      }
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_950);
    std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&data);
  }
  std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::vector
            ((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> *)
             &__range1_2);
  sVar20 = std::
           vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::size((vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&nd);
  std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::reserve
            ((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> *)
             &__range1_2,sVar20 * 2 + 5);
  __end1_2 = std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>::begin
                       ((vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                         *)local_748);
  tri_1 = (Triangle *)
          std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>::end
                    ((vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> *)
                     local_748);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<Assimp::Unreal::Triangle_*,_std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>_>
                             *)&tri_1), bVar4) {
    pTVar30 = __gnu_cxx::
              __normal_iterator<Assimp::Unreal::Triangle_*,_std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>_>
              ::operator*(&__end1_2);
    Unreal::TempMat::TempMat((TempMat *)((long)&nt._M_current + 4),pTVar30);
    local_ac8._M_current =
         (TempMat *)
         std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::begin
                   ((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> *)
                    &__range1_2);
    local_ad0 = (TempMat *)
                std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::end
                          ((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                            *)&__range1_2);
    local_ac0 = std::
                find<__gnu_cxx::__normal_iterator<Assimp::Unreal::TempMat*,std::vector<Assimp::Unreal::TempMat,std::allocator<Assimp::Unreal::TempMat>>>,Assimp::Unreal::TempMat>
                          (local_ac8,
                           (__normal_iterator<Assimp::Unreal::TempMat_*,_std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>_>
                            )local_ad0,(TempMat *)((long)&nt._M_current + 4));
    local_ad8._M_current =
         (TempMat *)
         std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::end
                   ((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> *)
                    &__range1_2);
    bVar4 = __gnu_cxx::operator==(&local_ac0,&local_ad8);
    if (bVar4) {
      sVar20 = std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::size
                         ((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                           *)&__range1_2);
      pTVar30->matIndex = (uint)sVar20;
      std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::push_back
                ((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> *)
                 &__range1_2,(value_type *)((long)&nt._M_current + 4));
      pScene->mNumMeshes = pScene->mNumMeshes + 1;
    }
    else {
      local_ae0._M_current =
           (TempMat *)
           std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::begin
                     ((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> *)
                      &__range1_2);
      dVar31 = __gnu_cxx::operator-(&local_ac0,&local_ae0);
      pTVar30->matIndex = (uint)dVar31;
      pTVar21 = __gnu_cxx::
                __normal_iterator<Assimp::Unreal::TempMat_*,_std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>_>
                ::operator->(&local_ac0);
      pTVar21->numFaces = pTVar21->numFaces + 1;
    }
    __gnu_cxx::
    __normal_iterator<Assimp::Unreal::Triangle_*,_std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>_>
    ::operator++(&__end1_2);
  }
  if (pScene->mNumMeshes == 0) {
    m._6_1_ = 1;
    pDVar15 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&i_2,"UNREAL: Unable to find valid mesh data",(allocator *)((long)&m + 7));
    DeadlyImportError::DeadlyImportError(pDVar15,(string *)&i_2);
    m._6_1_ = 0;
    __cxa_throw(pDVar15,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  ppaVar22 = (aiMesh **)operator_new__((ulong)pScene->mNumMeshes << 3);
  pScene->mMeshes = ppaVar22;
  pScene->mNumMaterials = pScene->mNumMeshes;
  ppaVar23 = (aiMaterial **)operator_new__((ulong)pScene->mNumMeshes << 3);
  pScene->mMaterials = ppaVar23;
  *(uint *)((long)pb._M_t.
                  super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                  .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl + 0x460) =
       pScene->mNumMeshes;
  pvVar24 = operator_new__((ulong)*(uint *)((long)pb._M_t.
                                                  super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                                                  .super__Head_base<0UL,_Assimp::IOStream_*,_false>.
                                                  _M_head_impl + 0x460) << 2);
  *(void **)((long)pb._M_t.
                   super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                   .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl + 0x468) = pvVar24
  ;
  m._0_4_ = 0;
  do {
    if (pScene->mNumMeshes <= (uint)m) {
      __end1_3 = std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>::
                 begin((vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                        *)local_748);
      tri_2 = (Triangle *)
              std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>::end
                        ((vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                          *)local_748);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end1_3,
                                (__normal_iterator<Assimp::Unreal::Triangle_*,_std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>_>
                                 *)&tri_2), bVar4) {
        pTVar30 = __gnu_cxx::
                  __normal_iterator<Assimp::Unreal::Triangle_*,_std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>_>
                  ::operator*(&__end1_3);
        Unreal::TempMat::TempMat((TempMat *)((long)&nt_1._M_current + 4),pTVar30);
        local_fa0._M_current =
             (TempMat *)
             std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::begin
                       ((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> *
                        )&__range1_2);
        mesh = (aiMesh *)
               std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::end
                         ((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                           *)&__range1_2);
        local_f98 = std::
                    find<__gnu_cxx::__normal_iterator<Assimp::Unreal::TempMat*,std::vector<Assimp::Unreal::TempMat,std::allocator<Assimp::Unreal::TempMat>>>,Assimp::Unreal::TempMat>
                              (local_fa0,
                               (__normal_iterator<Assimp::Unreal::TempMat_*,_std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>_>
                                )mesh,(TempMat *)((long)&nt_1._M_current + 4));
        ppaVar22 = pScene->mMeshes;
        f = (aiFace *)
            std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::begin
                      ((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> *)
                       &__range1_2);
        dVar31 = __gnu_cxx::operator-
                           (&local_f98,
                            (__normal_iterator<Assimp::Unreal::TempMat_*,_std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>_>
                             *)&f);
        local_fb0 = ppaVar22[dVar31];
        uVar11 = local_fb0->mNumFaces;
        local_fb0->mNumFaces = uVar11 + 1;
        paVar34 = local_fb0->mFaces + uVar11;
        paVar34->mNumIndices = 3;
        puVar32 = (uint *)operator_new__(0xc);
        paVar34->mIndices = puVar32;
        local_fc4 = 0;
        while (local_fc4 < 3) {
          paVar34->mIndices[local_fc4] = local_fb0->mNumVertices;
          pvVar33 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               local_898,(ulong)pTVar30->mVertex[local_fc4]);
          paVar27 = local_fb0->mVertices;
          uVar11 = local_fb0->mNumVertices;
          paVar27[uVar11].z = pvVar33->z;
          fVar1 = pvVar33->y;
          paVar27 = paVar27 + uVar11;
          paVar27->x = pvVar33->x;
          paVar27->y = fVar1;
          aiVector3t<float>::aiVector3t
                    ((aiVector3t<float> *)&hero.super_BaseProcess.progress,
                     (float)pTVar30->mTex[local_fc4][0] / 255.0,
                     1.0 - (float)pTVar30->mTex[local_fc4][1] / 255.0,0.0);
          paVar27 = local_fb0->mTextureCoords[0];
          uVar11 = local_fb0->mNumVertices;
          *(ProgressHandler **)(paVar27 + uVar11) = hero.super_BaseProcess.progress;
          paVar27[uVar11].z = local_fc8;
          local_fc4 = local_fc4 + 1;
          local_fb0->mNumVertices = local_fb0->mNumVertices + 1;
        }
        __gnu_cxx::
        __normal_iterator<Assimp::Unreal::Triangle_*,_std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>_>
        ::operator++(&__end1_3);
      }
      MakeLeftHandedProcess::MakeLeftHandedProcess
                ((MakeLeftHandedProcess *)&flipper.super_BaseProcess.progress);
      MakeLeftHandedProcess::Execute
                ((MakeLeftHandedProcess *)&flipper.super_BaseProcess.progress,pScene);
      FlipWindingOrderProcess::FlipWindingOrderProcess((FlipWindingOrderProcess *)local_1000);
      FlipWindingOrderProcess::Execute((FlipWindingOrderProcess *)local_1000,pScene);
      FlipWindingOrderProcess::~FlipWindingOrderProcess((FlipWindingOrderProcess *)local_1000);
      MakeLeftHandedProcess::~MakeLeftHandedProcess
                ((MakeLeftHandedProcess *)&flipper.super_BaseProcess.progress);
      std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::~vector
                ((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> *)
                 &__range1_2);
      std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                (&local_8f0);
      std::
      vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&nd);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_898);
      StreamReader<false,_false>::~StreamReader((StreamReader<false,_false> *)local_808);
      std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>::~vector
                ((vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> *)
                 local_748);
      StreamReader<false,_false>::~StreamReader((StreamReader<false,_false> *)local_6e0);
      std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                (&local_658);
      std::__cxx11::string::~string((string *)local_b0);
      std::__cxx11::string::~string((string *)(uc_path.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(a_path.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(d_path.field_2._M_local_buf + 8));
      return;
    }
    this_01 = (aiMesh *)operator_new(0x520);
    aiMesh::aiMesh(this_01);
    pScene->mMeshes[(uint)m] = this_01;
    this_01->mPrimitiveTypes = 4;
    pvVar25 = std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::
              operator[]((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          *)&__range1_2,(ulong)(uint)m);
    uVar11 = pvVar25->numFaces;
    uVar18 = (ulong)uVar11;
    puVar26 = (ulong *)operator_new__(uVar18 << 4 | 8);
    *puVar26 = uVar18;
    paVar34 = (aiFace *)(puVar26 + 1);
    if (uVar18 != 0) {
      local_12b8 = paVar34;
      do {
        aiFace::aiFace(local_12b8);
        local_12b8 = local_12b8 + 1;
      } while (local_12b8 != paVar34 + uVar18);
    }
    this_01->mFaces = paVar34;
    uVar18 = (ulong)(uVar11 * 3);
    paVar27 = (aiVector3D *)operator_new__(uVar18 * 0xc);
    if (uVar18 != 0) {
      local_12e0 = paVar27;
      do {
        aiVector3t<float>::aiVector3t(local_12e0);
        local_12e0 = local_12e0 + 1;
      } while (local_12e0 != paVar27 + uVar18);
    }
    this_01->mVertices = paVar27;
    uVar18 = (ulong)(uVar11 * 3);
    paVar27 = (aiVector3D *)operator_new__(uVar18 * 0xc);
    if (uVar18 != 0) {
      local_1308 = paVar27;
      do {
        aiVector3t<float>::aiVector3t(local_1308);
        local_1308 = local_1308 + 1;
      } while (local_1308 != paVar27 + uVar18);
    }
    this_01->mTextureCoords[0] = paVar27;
    *(uint *)(*(long *)((long)pb._M_t.
                              super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                              .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl + 0x468
                       ) + (ulong)(uint)m * 4) = (uint)m;
    this_02 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_02);
    pScene->mMaterials[(uint)m] = this_02;
    aiColor3D::aiColor3D((aiColor3D *)(s.data + 0x3f8),1.0,1.0,1.0);
    aiString::aiString((aiString *)&opac);
    uVar11 = (uint)m;
    pvVar25 = std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::
              operator[]((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          *)&__range1_2,(ulong)(uint)m);
    snprintf((char *)&twosided,0x400,"mat%u_tx%u_",(ulong)uVar11,(ulong)pvVar25->tex);
    pvVar25 = std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::
              operator[]((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          *)&__range1_2,(ulong)(uint)m);
    if (pvVar25->type == MF_NORMAL_TS) {
      local_f34 = 1;
      aiMaterial::AddProperty(this_02,&local_f34,1,"$mat.twosided",0,0);
      strcat((char *)&twosided,"ts_");
    }
    else {
      strcat((char *)&twosided,"os_");
    }
    pvVar25 = std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::
              operator[]((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          *)&__range1_2,(ulong)(uint)m);
    if (pvVar25->type == MF_NORMAL_TRANS_TS) {
      local_f38 = 0.9;
      aiMaterial::AddProperty(this_02,&local_f38,1,"$mat.opacity",0,0);
      strcat((char *)&twosided,"tran_");
    }
    else {
      strcat((char *)&twosided,"opaq_");
    }
    pvVar25 = std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::
              operator[]((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          *)&__range1_2,(ulong)(uint)m);
    if (pvVar25->type == MF_WEAPON_PLACEHOLDER) {
      opac = (float)snprintf((char *)&twosided,0x400,"$WeaponTag$");
      aiColor3D::aiColor3D((aiColor3D *)((long)&it_1._M_current + 4),0.0,0.0,0.0);
      aiColor3D::operator=((aiColor3D *)(s.data + 0x3f8),(aiColor3D *)((long)&it_1._M_current + 4));
    }
    aiMaterial::AddProperty(this_02,(aiColor3D *)(s.data + 0x3f8),1,"$clr.diffuse",0,0);
    sVar28 = strlen((char *)&twosided);
    opac = (float)sVar28;
    aiMaterial::AddProperty(this_02,(aiString *)&opac,"?mat.name",0,0);
    pvVar25 = std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::
              operator[]((vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          *)&__range1_2,(ulong)(uint)m);
    it_1._M_current._0_4_ = pvVar25->tex;
    local_f58._M_current =
         (pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::begin((vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&nd);
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_int,std::__cxx11::string>const*,std::vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>>
    ::__normal_iterator<std::pair<unsigned_int,std::__cxx11::string>*>
              ((__normal_iterator<std::pair<unsigned_int,std::__cxx11::string>const*,std::vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>>
                *)&local_f50,&local_f58);
    while( true ) {
      __range1_3 = (vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> *)
                   std::
                   vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end((vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&nd);
      bVar4 = __gnu_cxx::operator!=
                        (&local_f50,
                         (__normal_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&__range1_3);
      if (!bVar4) break;
      ppVar29 = __gnu_cxx::
                __normal_iterator<const_std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator*(&local_f50);
      if (ppVar29->first == (uint)it_1._M_current) {
        ppVar29 = __gnu_cxx::
                  __normal_iterator<const_std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator*(&local_f50);
        aiString::Set((aiString *)&opac,&ppVar29->second);
        aiMaterial::AddProperty(this_02,(aiString *)&opac,"$tex.file",1,0);
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&local_f50);
    }
    m._0_4_ = (uint)m + 1;
  } while( true );
}

Assistant:

void UnrealImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    // For any of the 3 files being passed get the three correct paths
    // First of all, determine file extension
    std::string::size_type pos = pFile.find_last_of('.');
    std::string extension = GetExtension(pFile);

    std::string d_path,a_path,uc_path;
    if (extension == "3d")      {
        // jjjj_d.3d
        // jjjj_a.3d
        pos = pFile.find_last_of('_');
        if (std::string::npos == pos) {
            throw DeadlyImportError("UNREAL: Unexpected naming scheme");
        }
        extension = pFile.substr(0,pos);
    }
    else {
        extension = pFile.substr(0,pos);
    }

    // build proper paths
    d_path  = extension+"_d.3d";
    a_path  = extension+"_a.3d";
    uc_path = extension+".uc";

    ASSIMP_LOG_DEBUG_F( "UNREAL: data file is ", d_path);
    ASSIMP_LOG_DEBUG_F("UNREAL: aniv file is ", a_path);
    ASSIMP_LOG_DEBUG_F("UNREAL: uc file is ", uc_path);

    // and open the files ... we can't live without them
    std::unique_ptr<IOStream> p(pIOHandler->Open(d_path));
    if (!p)
        throw DeadlyImportError("UNREAL: Unable to open _d file");
    StreamReaderLE d_reader(pIOHandler->Open(d_path));

    const uint16_t numTris = d_reader.GetI2();
    const uint16_t numVert = d_reader.GetI2();
    d_reader.IncPtr(44);
    if (!numTris || numVert < 3)
        throw DeadlyImportError("UNREAL: Invalid number of vertices/triangles");

    // maximum texture index
    unsigned int maxTexIdx = 0;

    // collect triangles
    std::vector<Unreal::Triangle> triangles(numTris);
    for (auto & tri : triangles) {
        for (unsigned int i = 0; i < 3;++i) {

            tri.mVertex[i] = d_reader.GetI2();
            if (tri.mVertex[i] >= numTris)  {
                ASSIMP_LOG_WARN("UNREAL: vertex index out of range");
                tri.mVertex[i] = 0;
            }
        }
        tri.mType = d_reader.GetI1();

        // handle mesh flagss?
        if (configHandleFlags)
            tri.mType = Unreal::MF_NORMAL_OS;
        else {
            // ignore MOD and MASKED for the moment, treat them as two-sided
            if (tri.mType == Unreal::MF_NORMAL_MOD_TS || tri.mType == Unreal::MF_NORMAL_MASKED_TS)
                tri.mType = Unreal::MF_NORMAL_TS;
        }
        d_reader.IncPtr(1);

        for (unsigned int i = 0; i < 3;++i)
            for (unsigned int i2 = 0; i2 < 2;++i2)
                tri.mTex[i][i2] = d_reader.GetI1();

        tri.mTextureNum = d_reader.GetI1();
        maxTexIdx = std::max(maxTexIdx,(unsigned int)tri.mTextureNum);
        d_reader.IncPtr(1);
    }

    p.reset(pIOHandler->Open(a_path));
    if (!p)
        throw DeadlyImportError("UNREAL: Unable to open _a file");
    StreamReaderLE a_reader(pIOHandler->Open(a_path));

    // read number of frames
    const uint32_t numFrames = a_reader.GetI2();
    if (configFrameID >= numFrames)
        throw DeadlyImportError("UNREAL: The requested frame does not exist");

    uint32_t st = a_reader.GetI2();
    if (st != numVert*4)
        throw DeadlyImportError("UNREAL: Unexpected aniv file length");

    // skip to our frame
    a_reader.IncPtr(configFrameID *numVert*4);

    // collect vertices
    std::vector<aiVector3D> vertices(numVert);
    for (auto &vertex : vertices)    {
        int32_t val = a_reader.GetI4();
        Unreal::DecompressVertex(vertex ,val);
    }

    // list of textures.
    std::vector< std::pair<unsigned int, std::string> > textures;

    // allocate the output scene
    aiNode* nd = pScene->mRootNode = new aiNode();
    nd->mName.Set("<UnrealRoot>");

    // we can live without the uc file if necessary
    std::unique_ptr<IOStream> pb (pIOHandler->Open(uc_path));
    if (pb.get())   {

        std::vector<char> _data;
        TextFileToBuffer(pb.get(),_data);
        const char* data = &_data[0];

        std::vector< std::pair< std::string,std::string > > tempTextures;

        // do a quick search in the UC file for some known, usually texture-related, tags
        for (;*data;++data) {
            if (TokenMatchI(data,"#exec",5))    {
                SkipSpacesAndLineEnd(&data);

                // #exec TEXTURE IMPORT [...] NAME=jjjjj [...] FILE=jjjj.pcx [...]
                if (TokenMatchI(data,"TEXTURE",7))  {
                    SkipSpacesAndLineEnd(&data);

                    if (TokenMatchI(data,"IMPORT",6))   {
                        tempTextures.push_back(std::pair< std::string,std::string >());
                        std::pair< std::string,std::string >& me = tempTextures.back();
                        for (;!IsLineEnd(*data);++data) {
                            if (!::ASSIMP_strincmp(data,"NAME=",5)) {
                                const char *d = data+=5;
                                for (;!IsSpaceOrNewLine(*data);++data);
                                me.first = std::string(d,(size_t)(data-d));
                            }
                            else if (!::ASSIMP_strincmp(data,"FILE=",5))    {
                                const char *d = data+=5;
                                for (;!IsSpaceOrNewLine(*data);++data);
                                me.second = std::string(d,(size_t)(data-d));
                            }
                        }
                        if (!me.first.length() || !me.second.length())
                            tempTextures.pop_back();
                    }
                }
                // #exec MESHMAP SETTEXTURE MESHMAP=box NUM=1 TEXTURE=Jtex1
                // #exec MESHMAP SCALE MESHMAP=box X=0.1 Y=0.1 Z=0.2
                else if (TokenMatchI(data,"MESHMAP",7)) {
                    SkipSpacesAndLineEnd(&data);

                    if (TokenMatchI(data,"SETTEXTURE",10)) {

                        textures.push_back(std::pair<unsigned int, std::string>());
                        std::pair<unsigned int, std::string>& me = textures.back();

                        for (;!IsLineEnd(*data);++data) {
                            if (!::ASSIMP_strincmp(data,"NUM=",4))  {
                                data += 4;
                                me.first = strtoul10(data,&data);
                            }
                            else if (!::ASSIMP_strincmp(data,"TEXTURE=",8)) {
                                data += 8;
                                const char *d = data;
                                for (;!IsSpaceOrNewLine(*data);++data);
                                me.second = std::string(d,(size_t)(data-d));

                                // try to find matching path names, doesn't care if we don't find them
                                for (std::vector< std::pair< std::string,std::string > >::const_iterator it = tempTextures.begin();
                                     it != tempTextures.end(); ++it)    {
                                    if ((*it).first == me.second)   {
                                        me.second = (*it).second;
                                        break;
                                    }
                                }
                            }
                        }
                    }
                    else if (TokenMatchI(data,"SCALE",5)) {

                        for (;!IsLineEnd(*data);++data) {
                            if (data[0] == 'X' && data[1] == '=')   {
                                data = fast_atoreal_move<float>(data+2,(float&)nd->mTransformation.a1);
                            }
                            else if (data[0] == 'Y' && data[1] == '=')  {
                                data = fast_atoreal_move<float>(data+2,(float&)nd->mTransformation.b2);
                            }
                            else if (data[0] == 'Z' && data[1] == '=')  {
                                data = fast_atoreal_move<float>(data+2,(float&)nd->mTransformation.c3);
                            }
                        }
                    }
                }
            }
        }
    }
    else    {
        ASSIMP_LOG_ERROR("Unable to open .uc file");
    }

    std::vector<Unreal::TempMat> materials;
    materials.reserve(textures.size()*2+5);

    // find out how many output meshes and materials we'll have and build material indices
	for (Unreal::Triangle &tri : triangles) {
        Unreal::TempMat mat(tri);
        std::vector<Unreal::TempMat>::iterator nt = std::find(materials.begin(),materials.end(),mat);
        if (nt == materials.end()) {
            // add material
            tri.matIndex = static_cast<unsigned int>(materials.size());
            mat.numFaces = 1;
            materials.push_back(mat);

            ++pScene->mNumMeshes;
        }
        else {
            tri.matIndex = static_cast<unsigned int>(nt-materials.begin());
            ++nt->numFaces;
        }
    }

    if (!pScene->mNumMeshes) {
        throw DeadlyImportError("UNREAL: Unable to find valid mesh data");
    }

    // allocate meshes and bind them to the node graph
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials = pScene->mNumMeshes];

    nd->mNumMeshes  = pScene->mNumMeshes;
    nd->mMeshes = new unsigned int[nd->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aiMesh* m = pScene->mMeshes[i] =  new aiMesh();
        m->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        const unsigned int num = materials[i].numFaces;
        m->mFaces            = new aiFace     [num];
        m->mVertices         = new aiVector3D [num*3];
        m->mTextureCoords[0] = new aiVector3D [num*3];

        nd->mMeshes[i] = i;

        // create materials, too
        aiMaterial* mat = new aiMaterial();
        pScene->mMaterials[i] = mat;

        // all white by default - texture rulez
        aiColor3D color(1.f,1.f,1.f);

        aiString s;
        ::ai_snprintf( s.data, MAXLEN, "mat%u_tx%u_",i,materials[i].tex );

        // set the two-sided flag
        if (materials[i].type == Unreal::MF_NORMAL_TS) {
            const int twosided = 1;
            mat->AddProperty(&twosided,1,AI_MATKEY_TWOSIDED);
            ::strcat(s.data,"ts_");
        }
        else ::strcat(s.data,"os_");

        // make TRANS faces 90% opaque that RemRedundantMaterials won't catch us
        if (materials[i].type == Unreal::MF_NORMAL_TRANS_TS)    {
            const float opac = 0.9f;
            mat->AddProperty(&opac,1,AI_MATKEY_OPACITY);
            ::strcat(s.data,"tran_");
        }
        else ::strcat(s.data,"opaq_");

        // a special name for the weapon attachment point
        if (materials[i].type == Unreal::MF_WEAPON_PLACEHOLDER) {
            s.length = ::ai_snprintf( s.data, MAXLEN, "$WeaponTag$" );
            color = aiColor3D(0.f,0.f,0.f);
        }

        // set color and name
        mat->AddProperty(&color,1,AI_MATKEY_COLOR_DIFFUSE);
        s.length = ::strlen(s.data);
        mat->AddProperty(&s,AI_MATKEY_NAME);

        // set texture, if any
        const unsigned int tex = materials[i].tex;
        for (std::vector< std::pair< unsigned int, std::string > >::const_iterator it = textures.begin();it != textures.end();++it) {
            if ((*it).first == tex) {
                s.Set((*it).second);
                mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(0));
                break;
            }
        }
    }

    // fill them.
    for (const Unreal::Triangle &tri : triangles) {
        Unreal::TempMat mat(tri);
        std::vector<Unreal::TempMat>::iterator nt = std::find(materials.begin(),materials.end(),mat);

        aiMesh* mesh = pScene->mMeshes[nt-materials.begin()];
        aiFace& f    = mesh->mFaces[mesh->mNumFaces++];
        f.mIndices   = new unsigned int[f.mNumIndices = 3];

        for (unsigned int i = 0; i < 3;++i,mesh->mNumVertices++) {
            f.mIndices[i] = mesh->mNumVertices;

            mesh->mVertices[mesh->mNumVertices] = vertices[ tri.mVertex[i] ];
            mesh->mTextureCoords[0][mesh->mNumVertices] = aiVector3D( tri.mTex[i][0] / 255.f, 1.f - tri.mTex[i][1] / 255.f, 0.f);
        }
    }

    // convert to RH
    MakeLeftHandedProcess hero;
    hero.Execute(pScene);

    FlipWindingOrderProcess flipper;
    flipper.Execute(pScene);
}